

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

int fmt::sprintf_abi_cxx11_(char *__s,char *__format,...)

{
  ArgList args;
  uint64_t in_RCX;
  BasicWriter<char> *in_RDX;
  MemoryWriter w;
  BasicMemoryWriter<char,_std::allocator<char>_> *this;
  allocator<char> *in_stack_fffffffffffffd88;
  BasicMemoryWriter<char,_std::allocator<char>_> *in_stack_fffffffffffffd90;
  BasicCStringRef<char> in_stack_fffffffffffffda0;
  BasicWriter<char> *in_stack_fffffffffffffda8;
  allocator<char> local_249 [553];
  BasicWriter<char> *local_20;
  uint64_t uStack_18;
  anon_union_8_2_de49483c_for_ArgList_1 local_10;
  char *local_8;
  
  this = (BasicMemoryWriter<char,_std::allocator<char>_> *)__s;
  local_20 = in_RDX;
  uStack_18 = in_RCX;
  local_10 = (anon_union_8_2_de49483c_for_ArgList_1)__format;
  local_8 = __s;
  std::allocator<char>::allocator();
  BasicMemoryWriter<char,_std::allocator<char>_>::BasicMemoryWriter
            (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
  std::allocator<char>::~allocator(local_249);
  args.field_1.values_ = local_10.values_;
  args.types_ = uStack_18;
  printf<char>(local_20,in_stack_fffffffffffffda0,args);
  BasicWriter<char>::str_abi_cxx11_(in_stack_fffffffffffffda8);
  BasicMemoryWriter<char,_std::allocator<char>_>::~BasicMemoryWriter(this);
  return (int)__s;
}

Assistant:

inline std::string sprintf(CStringRef format, ArgList args) {
  MemoryWriter w;
  printf(w, format, args);
  return w.str();
}